

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::format_assoc<ELFIO::version_table_t[2],unsigned_char>
          (string *__return_storage_ptr__,dump *this,version_table_t (*table) [2],uchar *key)

{
  bool bVar1;
  ostream *poVar2;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  uchar *key_local;
  version_table_t (*table_local) [2];
  string *str;
  
  find_value_in_table<ELFIO::version_table_t[2],unsigned_char>
            (__return_storage_ptr__,this,table,key);
  bVar1 = std::operator==(__return_storage_ptr__,"?");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,(string *)__return_storage_ptr__);
    poVar2 = std::operator<<(poVar2," (0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = std::operator<<(poVar2,(uchar)(*table)[0].key);
    std::operator<<(poVar2,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_assoc( const T& table, const K& key )
    {
        std::string str = find_value_in_table( table, key );
        if ( str == "?" ) {
            std::ostringstream oss;
            oss << str << " (0x" << std::hex << key << ")";
            str = oss.str();
        }

        return str;
    }